

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O2

PinResult __thiscall
density::detail::PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2>
::pin(PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)2> *this,
     void *i_address)

{
  PinResult PVar1;
  uintptr_t uint_pointer;
  void *i_address_00;
  void *i_address_01;
  
  i_address_00 = (void *)((ulong)i_address & 0xffffffffffff0000);
  i_address_01 = this->m_pinned_page;
  if (i_address_01 == i_address_00) {
    PVar1 = AlreadyPinned;
  }
  else {
    if (i_address_00 != (void *)0x0) {
      PageAllocator<density::detail::SystemPageManager<65536UL>_>::pin_page(i_address_00);
      i_address_01 = this->m_pinned_page;
    }
    if (i_address_01 != (void *)0x0) {
      PageAllocator<density::detail::SystemPageManager<65536UL>_>::unpin_page(i_address_01);
    }
    this->m_pinned_page = i_address_00;
    PVar1 = PinSuccessfull;
  }
  return PVar1;
}

Assistant:

PinResult pin(void * i_address) noexcept
            {
                auto const page = address_lower_align(i_address, ALLOCATOR_TYPE::page_alignment);
                if (page == m_pinned_page)
                {
                    return AlreadyPinned;
                }
                if (ConstConditional(PROGRESS_GUARANTEE == progress_wait_free))
                {
                    if (page != nullptr)
                    {
                        if (!m_allocator->try_pin_page(progress_wait_free, page))
                            return PinFailed;
                    }
                    if (m_pinned_page != nullptr)
                        m_allocator->unpin_page(progress_wait_free, m_pinned_page);
                }
                else
                {
                    if (page != nullptr)
                        m_allocator->pin_page(page);
                    if (m_pinned_page != nullptr)
                        m_allocator->unpin_page(m_pinned_page);
                }
                m_pinned_page = page;
                return PinSuccessfull;
            }